

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

Function * __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::getFunctionOrImport
          (LegalizeJSInterface *this,Module *module,Name name,Type params,Type results)

{
  IString str;
  Name base;
  IString str_00;
  Name name_00;
  pointer pFVar1;
  char *pcVar2;
  Name name_01;
  Function *ret;
  Name local_188;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_178;
  uintptr_t local_160;
  uintptr_t local_158;
  Signature local_150;
  HeapType local_140;
  char *local_138;
  HeapType HStack_130;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_128;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  string_view local_e8;
  Function *local_d8;
  Function *f_1;
  ImportInfo info;
  Function *f;
  Module *module_local;
  Type results_local;
  Type params_local;
  Name name_local;
  
  pcVar2 = name.super_IString.str._M_len;
  name_00.super_IString.str._M_str = pcVar2;
  name_00.super_IString.str._M_len = (size_t)module;
  info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)module;
  params_local.id = (uintptr_t)module;
  name_local.super_IString.str._M_str = (char *)Module::getFunctionOrNull((Module *)this,name_00);
  if ((Function *)name_local.super_IString.str._M_str == (Function *)0x0) {
    ImportInfo::ImportInfo((ImportInfo *)&f_1,(Module *)this);
    str_00.str._M_str = (char *)ENV._8_8_;
    str_00.str._M_len = ENV._0_8_;
    wasm::Name::Name((Name *)&local_e8,str_00);
    base.super_IString.str._M_str = pcVar2;
    base.super_IString.str._M_len = params_local.id;
    local_d8 = ImportInfo::getImportedFunction((ImportInfo *)&f_1,(Name)local_e8,base);
    if (local_d8 == (Function *)0x0) {
      local_138 = (char *)params_local.id;
      local_160 = params.id;
      local_158 = name.super_IString.str._M_str;
      HStack_130.id = (uintptr_t)pcVar2;
      Signature::Signature(&local_150,(Type)name.super_IString.str._M_str,params);
      HeapType::HeapType(&local_140,local_150);
      local_178.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_178);
      name_01.super_IString.str._M_str = local_138;
      name_01.super_IString.str._M_len = (size_t)&local_128;
      Builder::makeFunction
                (name_01,HStack_130,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_140.id,
                 (Expression *)&local_178);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_178);
      str.str._M_str = (char *)ENV._8_8_;
      str.str._M_len = ENV._0_8_;
      wasm::Name::Name(&local_188,str);
      pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_128);
      wasm::Name::operator=(&(pFVar1->super_Importable).module,&local_188);
      pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_128);
      wasm::Name::operator=(&(pFVar1->super_Importable).base,(Name *)&params_local);
      name_local.super_IString.str._M_str =
           (char *)std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                             (&local_128);
      Module::addFunction((Module *)this,&local_128);
      import._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_128)
      ;
    }
    else {
      import._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = 1;
      name_local.super_IString.str._M_str = (char *)local_d8;
    }
    ImportInfo::~ImportInfo((ImportInfo *)&f_1);
  }
  return (Function *)name_local.super_IString.str._M_str;
}

Assistant:

static Function*
  getFunctionOrImport(Module* module, Name name, Type params, Type results) {
    // First look for the function by name
    if (Function* f = module->getFunctionOrNull(name)) {
      return f;
    }
    // Then see if its already imported
    ImportInfo info(*module);
    if (Function* f = info.getImportedFunction(ENV, name)) {
      return f;
    }
    // Failing that create a new function import.
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    auto* ret = import.get();
    module->addFunction(std::move(import));
    return ret;
  }